

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_charset_filter_module.c
# Opt level: O0

char * ngx_http_set_charset_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  int iVar1;
  long *plVar2;
  ngx_int_t nVar3;
  ngx_http_charset_main_conf_t *mcf;
  ngx_str_t var;
  ngx_str_t *value;
  ngx_int_t *cp;
  char *p;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  plVar2 = (long *)((long)conf + cmd->offset);
  if (*plVar2 == -1) {
    var.data = (u_char *)cf->args->elts;
    if ((cmd->offset == 0) && (iVar1 = strcmp(*(char **)(var.data + 0x18),"off"), iVar1 == 0)) {
      *plVar2 = -2;
      return (char *)0x0;
    }
    if (**(char **)(var.data + 0x18) == '$') {
      mcf = (ngx_http_charset_main_conf_t *)(*(long *)(var.data + 0x10) + -1);
      var.len = *(long *)(var.data + 0x18) + 1;
      nVar3 = ngx_http_get_variable_index(cf,(ngx_str_t *)&mcf);
      *plVar2 = nVar3;
      if (*plVar2 == -1) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        *plVar2 = *plVar2 + 0x10000;
        cf_local = (ngx_conf_t *)0x0;
      }
    }
    else {
      nVar3 = ngx_http_add_charset
                        (*(ngx_array_t **)(*cf->ctx + ngx_http_charset_filter_module.ctx_index * 8),
                         (ngx_str_t *)(var.data + 0x10));
      *plVar2 = nVar3;
      if (*plVar2 == -1) {
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
      else {
        cf_local = (ngx_conf_t *)0x0;
      }
    }
  }
  else {
    cf_local = (ngx_conf_t *)anon_var_dwarf_1243;
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_http_set_charset_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ngx_int_t                     *cp;
    ngx_str_t                     *value, var;
    ngx_http_charset_main_conf_t  *mcf;

    cp = (ngx_int_t *) (p + cmd->offset);

    if (*cp != NGX_CONF_UNSET) {
        return "is duplicate";
    }

    value = cf->args->elts;

    if (cmd->offset == offsetof(ngx_http_charset_loc_conf_t, charset)
        && ngx_strcmp(value[1].data, "off") == 0)
    {
        *cp = NGX_HTTP_CHARSET_OFF;
        return NGX_CONF_OK;
    }


    if (value[1].data[0] == '$') {
        var.len = value[1].len - 1;
        var.data = value[1].data + 1;

        *cp = ngx_http_get_variable_index(cf, &var);

        if (*cp == NGX_ERROR) {
            return NGX_CONF_ERROR;
        }

        *cp += NGX_HTTP_CHARSET_VAR;

        return NGX_CONF_OK;
    }

    mcf = ngx_http_conf_get_module_main_conf(cf,
                                             ngx_http_charset_filter_module);

    *cp = ngx_http_add_charset(&mcf->charsets, &value[1]);
    if (*cp == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}